

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O3

uint8_t pack_first_byte(int indexing_mode)

{
  if ((uint)indexing_mode < 3) {
    return (uint8_t)(0x100040 >> ((byte)(indexing_mode << 3) & 0x1f));
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_hd.c"
                ,0x401,"uint8_t pack_first_byte(int)");
}

Assistant:

static uint8_t pack_first_byte(int indexing_mode) {
  switch (indexing_mode) {
  case NGHTTP2_HD_WITH_INDEXING:
    return 0x40u;
  case NGHTTP2_HD_WITHOUT_INDEXING:
    return 0;
  case NGHTTP2_HD_NEVER_INDEXING:
    return 0x10u;
  default:
    assert(0);
  }
  /* This is required to compile with android NDK r10d +
     --enable-werror */
  return 0;
}